

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall
Lowerer::LowerBrBReturn(Lowerer *this,Instr *instr,JnHelperMethod helperMethod,bool isHelper)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  Opnd *pOVar5;
  RegOpnd *opndArg;
  Instr *pIVar6;
  HelperCallOpnd *src1Opnd;
  Instr *pIVar7;
  
  if ((instr->m_src1 == (Opnd *)0x0) || (instr->m_src2 != (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2771,"(instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr)",
                       "Expected 1 src opnds on BrB");
    if (!bVar2) goto LAB_005bdef3;
    *puVar4 = 0;
  }
  if ((instr->m_opcode != BrOnEmpty) && (instr->m_opcode != BrOnNotEmpty)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2772,
                       "(instr->m_opcode == Js::OpCode::BrOnEmpty || instr->m_opcode == Js::OpCode::BrOnNotEmpty)"
                       ,
                       "instr->m_opcode == Js::OpCode::BrOnEmpty || instr->m_opcode == Js::OpCode::BrOnNotEmpty"
                      );
    if (!bVar2) goto LAB_005bdef3;
    *puVar4 = 0;
  }
  pOVar5 = IR::Instr::UnlinkSrc1(instr);
  opndArg = GenerateForInEnumeratorLoad(this,pOVar5,instr);
  pIVar6 = LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&opndArg->super_Opnd);
  src1Opnd = IR::HelperCallOpnd::New(helperMethod,this->m_func);
  pOVar5 = IR::Instr::UnlinkDst(instr);
  pIVar7 = IR::Instr::New(Call,pOVar5,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar7);
  pIVar7 = LowererMD::LowerCall(&this->m_lowererMD,pIVar7,0);
  instr->m_opcode = instr->m_opcode == BrOnNotEmpty | BrFalse_A;
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_005bdef3;
    *puVar4 = 0;
  }
  func = instr->m_func;
  if (pOVar5->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) goto LAB_005bdef3;
    *puVar4 = 0;
  }
  bVar3 = pOVar5->field_0xb;
  if ((bVar3 & 2) != 0) {
    pOVar5 = IR::Opnd::Copy(pOVar5,func);
    bVar3 = pOVar5->field_0xb;
  }
  pOVar5->field_0xb = bVar3 | 2;
  instr->m_src1 = pOVar5;
  if (instr->m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar2) {
LAB_005bdef3:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pIVar7 = LowerCondBranchCheckBailOut(this,(BranchInstr *)instr,pIVar7,isHelper);
  if (isHelper) {
    if (pIVar7->m_kind != InstrKindBranch) {
      pIVar7 = IR::Instr::GetNextBranchOrLabel(pIVar7);
    }
    if (pIVar7->m_kind == InstrKindBranch) {
      *(undefined1 *)((long)&pIVar7[1]._vptr_Instr + 2) = 1;
    }
  }
  return pIVar6;
}

Assistant:

IR::Instr *
Lowerer::LowerBrBReturn(IR::Instr * instr, IR::JnHelperMethod helperMethod, bool isHelper)
{
    IR::Instr * instrPrev;
    IR::Instr * instrCall;
    IR::HelperCallOpnd  * opndHelper;
    IR::Opnd  * opndDst;

    AssertMsg(instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr, "Expected 1 src opnds on BrB");
    Assert(instr->m_opcode == Js::OpCode::BrOnEmpty || instr->m_opcode == Js::OpCode::BrOnNotEmpty);
    IR::RegOpnd * forInEnumeratorRegOpnd = GenerateForInEnumeratorLoad(instr->UnlinkSrc1(), instr);
    instrPrev = m_lowererMD.LoadHelperArgument(instr, forInEnumeratorRegOpnd);

    // Generate helper call to convert the unknown operand to boolean

    opndHelper = IR::HelperCallOpnd::New(helperMethod, this->m_func);

    opndDst = instr->UnlinkDst();
    instrCall = IR::Instr::New(Js::OpCode::Call, opndDst, opndHelper, this->m_func);

    instr->InsertBefore(instrCall);
    instrCall = m_lowererMD.LowerCall(instrCall, 0);

    // Branch on the result of the call
    instr->m_opcode = (instr->m_opcode == Js::OpCode::BrOnNotEmpty? Js::OpCode::BrTrue_A : Js::OpCode::BrFalse_A);
    instr->SetSrc1(opndDst);
    IR::Instr *loweredInstr;
    loweredInstr = this->LowerCondBranchCheckBailOut(instr->AsBranchInstr(), instrCall, isHelper);

#if DBG
    if (isHelper)
    {
        if (!loweredInstr->IsBranchInstr())
        {
            loweredInstr = loweredInstr->GetNextBranchOrLabel();
        }
        if (loweredInstr->IsBranchInstr())
        {
            loweredInstr->AsBranchInstr()->m_isHelperToNonHelperBranch = true;
        }
    }
#endif
    return instrPrev;
}